

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  StringLike<const_char_*> *regex;
  element_type *peVar5;
  DeathTest *gtest_dt;
  TypeParam mtx;
  element_type *local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [24];
  AssertHelper local_e8 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> local_b0;
  
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0);
  local_100._0_8_ = (char *)0x0;
  local_100._8_8_ = 0;
  local_110._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110._0_8_ = (element_type *)local_100;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock(&local_b0);
  }
  if ((element_type *)local_110._0_8_ != (element_type *)local_100) {
    operator_delete((void *)local_110._0_8_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_e8[0].data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_110,
               (testing *)local_e8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c8,(PolymorphicMatcher *)local_110);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("mtx.try_lock_for(std::chrono::seconds(1))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0xe9,(DeathTest **)&local_118);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c8);
    peVar5 = local_118;
    if (!bVar2) goto LAB_00185e0c;
    if (local_118 == (element_type *)0x0) goto LAB_00185e62;
    iVar3 = (**(code **)(local_118->pattern_ + 0x10))(local_118);
    peVar1 = local_118;
    if (iVar3 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)local_110,6);
      iVar3 = (**(code **)(local_118->pattern_ + 0x18))();
      bVar2 = testing::KilledBySignal::operator()((KilledBySignal *)local_110,iVar3);
      iVar3 = (**(code **)(peVar1->pattern_ + 0x20))(peVar1,(ulong)bVar2);
      if ((char)iVar3 == '\0') {
        (**(code **)(peVar5->pattern_ + 8))(peVar5);
        goto LAB_00185e0c;
      }
    }
    else if (iVar3 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_110._0_8_ = (element_type *)0x1;
        yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
        try_lock_for<long,std::ratio<1l,1l>>
                  ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0,
                   (duration<long,_std::ratio<1L,_1L>_> *)local_110);
      }
      (**(code **)(local_118->pattern_ + 0x28))(local_118,2);
      (**(code **)(peVar1->pattern_ + 0x28))(peVar1,0);
    }
    pcVar4 = peVar5->pattern_;
  }
  else {
LAB_00185e0c:
    testing::Message::Message((Message *)local_110);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xe9,pcVar4);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if ((element_type *)local_110._0_8_ == (element_type *)0x0) goto LAB_00185e62;
    pcVar4 = *(char **)local_110._0_8_;
    peVar5 = (element_type *)local_110._0_8_;
  }
  (**(code **)(pcVar4 + 8))(peVar5);
LAB_00185e62:
  local_100._0_8_ = (char *)0x0;
  local_100._8_8_ = 0;
  local_110._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110._0_8_ = (element_type *)local_100;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock(&local_b0);
  }
  if ((element_type *)local_110._0_8_ != (element_type *)local_100) {
    operator_delete((void *)local_110._0_8_);
  }
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0);
  return;
}

Assistant:

TYPED_TEST(CheckedTimedMutexTest, RecurseTryLockFor) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.try_lock_for(std::chrono::seconds(1)));
  ASSERT_NO_THROW(mtx.unlock());
}